

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

QSize __thiscall QGridLayout::maximumSize(QGridLayout *this)

{
  int iVar1;
  Int IVar2;
  QGridLayoutPrivate *this_00;
  long in_FS_OFFSET;
  QGridLayoutPrivate *d;
  int bottom;
  int right;
  int top;
  int left;
  QSize s;
  QGridLayoutPrivate *in_stack_ffffffffffffff88;
  AlignmentFlag other;
  QGridLayoutPrivate *this_01;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_44;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_40;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_3c;
  QSize local_30;
  int local_20 [4];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGridLayout *)0x3351ea);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = this_00;
  iVar1 = horizontalSpacing((QGridLayout *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  verticalSpacing((QGridLayout *)CONCAT44(iVar1,in_stack_ffffffffffffff98));
  local_10 = QGridLayoutPrivate::maximumSize(in_stack_ffffffffffffff88,0,0x33522d);
  local_20[3] = 0xaaaaaaaa;
  local_20[2] = 0xaaaaaaaa;
  local_20[1] = 0xaaaaaaaa;
  local_20[0] = -0x55555556;
  QGridLayoutPrivate::effectiveMargins(this_00,local_20 + 3,local_20 + 2,local_20 + 1,local_20);
  QSize::QSize((QSize *)this_01,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               (int)in_stack_ffffffffffffff88);
  QSize::operator+=((QSize *)this_01,(QSize *)in_stack_ffffffffffffff88);
  QSize::QSize((QSize *)this_01,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
               (int)in_stack_ffffffffffffff88);
  other = (AlignmentFlag)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_30 = QSize::boundedTo((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff98),(QSize *)this_01);
  local_10 = local_30;
  local_40.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)QLayoutItem::alignment((QLayoutItem *)this_01);
  local_3c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&((QFlags<Qt::AlignmentFlag> *)this_01,other);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
  if (IVar2 != 0) {
    QSize::setWidth((QSize *)this_01,other);
  }
  QLayoutItem::alignment((QLayoutItem *)this_01);
  local_44.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&((QFlags<Qt::AlignmentFlag> *)this_01,other);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_44);
  if (IVar2 != 0) {
    QSize::setHeight((QSize *)this_01,other);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QGridLayout::maximumSize() const
{
    Q_D(const QGridLayout);

    QSize s = d->maximumSize(horizontalSpacing(), verticalSpacing());
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    s += QSize(left + right, top + bottom);
    s = s.boundedTo(QSize(QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX));
    if (alignment() & Qt::AlignHorizontal_Mask)
        s.setWidth(QLAYOUTSIZE_MAX);
    if (alignment() & Qt::AlignVertical_Mask)
        s.setHeight(QLAYOUTSIZE_MAX);
    return s;
}